

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compressed_materialization_utils.cpp
# Opt level: O1

vector<duckdb::LogicalType,_true> * duckdb::CMUtils::IntegralTypes(void)

{
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *in_RDI;
  long lVar1;
  initializer_list<duckdb::LogicalType> __l;
  allocator_type local_79;
  LogicalType local_78 [4];
  
  LogicalType::LogicalType(local_78,UTINYINT);
  LogicalType::LogicalType(local_78 + 1,USMALLINT);
  LogicalType::LogicalType(local_78 + 2,UINTEGER);
  LogicalType::LogicalType(local_78 + 3,UBIGINT);
  __l._M_len = 4;
  __l._M_array = local_78;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (in_RDI,__l,&local_79);
  lVar1 = 0x48;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_78[0].id_ + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  return (vector<duckdb::LogicalType,_true> *)in_RDI;
}

Assistant:

const vector<LogicalType> CMUtils::IntegralTypes() {
	return {LogicalType::UTINYINT, LogicalType::USMALLINT, LogicalType::UINTEGER, LogicalType::UBIGINT};
}